

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O2

string * __thiscall
beast::unit_test::detail::reporter<void>::fmtdur_abi_cxx11_
          (string *__return_storage_ptr__,reporter<void> *this,duration *d)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  stringstream ss;
  long local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  uint auStack_170 [88];
  
  pp_Var1 = (this->super_runner)._vptr_runner;
  if ((long)pp_Var1 < 1000000000) {
    local_1a0 = (long)pp_Var1 / 1000000;
    boost::lexical_cast<std::__cxx11::string,long>
              (&local_198,(boost *)&local_1a0,(long *)((long)pp_Var1 % 1000000));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                     ,"ms");
    ::std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&local_198);
    *(uint *)((long)auStack_170 + *(long *)(local_198.field_2._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_170 + *(long *)(local_198.field_2._M_allocated_capacity - 0x18)) &
         0xfffffefb | 4;
    *(undefined8 *)
     ((long)&local_198.field_2 + *(long *)(local_198.field_2._M_allocated_capacity - 0x18) + 8) = 1;
    poVar2 = ::std::ostream::_M_insert<double>((double)((long)pp_Var1 / 1000000) / 1000.0);
    ::std::operator<<(poVar2,"s");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
reporter<_>::fmtdur(typename clock_type::duration const& d)
{
    using namespace std::chrono;
    auto const ms = duration_cast<milliseconds>(d);
    if(ms < seconds{1})
        return boost::lexical_cast<std::string>(
            ms.count()) + "ms";
    std::stringstream ss;
    ss << std::fixed << std::setprecision(1) <<
       (ms.count()/1000.) << "s";
    return ss.str();
}